

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  uint i;
  uint uVar2;
  long lVar3;
  uint uVar4;
  float *pfVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar16;
  double dVar15;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  
  if ((ulong)norm_colors->m_size == 0) {
    dVar8 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
  }
  else {
    pfVar5 = norm_colors->m_p->m_s + 2;
    dVar8 = 0.0;
    dVar9 = 0.0;
    uVar6 = 0;
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
    do {
      fVar1 = *pfVar5;
      uVar2 = (this->m_unique_colors).m_p[uVar6].m_weight;
      fVar14 = (float)*(undefined8 *)((vec<3U,_float> *)(pfVar5 + -2))->m_s;
      fVar16 = (float)((ulong)*(undefined8 *)((vec<3U,_float> *)(pfVar5 + -2))->m_s >> 0x20);
      if (uVar2 < 2) {
        dVar17 = (double)(fVar14 * fVar14);
        dVar19 = (double)(fVar14 * fVar16);
        dVar18 = (double)(fVar1 * fVar14);
        dVar20 = (double)(fVar1 * fVar16);
        dVar15 = (double)(fVar1 * fVar1);
        dVar21 = (double)(fVar16 * fVar16);
      }
      else {
        dVar21 = (double)uVar2;
        dVar17 = (double)(fVar14 * fVar14) * dVar21;
        dVar19 = (double)(fVar14 * fVar16) * dVar21;
        dVar18 = (double)(fVar1 * fVar14) * dVar21;
        dVar20 = (double)(fVar1 * fVar16) * dVar21;
        dVar15 = (double)(fVar1 * fVar1) * dVar21;
        dVar21 = (double)(fVar16 * fVar16) * dVar21;
      }
      dVar11 = dVar11 + dVar19;
      dVar10 = dVar10 + dVar17;
      dVar9 = dVar9 + dVar20;
      dVar8 = dVar8 + dVar18;
      dVar12 = dVar12 + dVar15;
      dVar13 = dVar13 + dVar21;
      uVar6 = uVar6 + 1;
      pfVar5 = pfVar5 + 3;
    } while (norm_colors->m_size != uVar6);
  }
  dVar15 = 0.699999988079071;
  dVar21 = 0.8999999761581421;
  dVar18 = 1.0;
  uVar2 = 0;
  do {
    dVar20 = dVar15 * dVar12 + dVar21 * dVar8 + dVar9 * dVar18;
    dVar19 = dVar15 * dVar8 + dVar21 * dVar10 + dVar18 * dVar11;
    dVar23 = dVar15 * dVar9 + dVar21 * dVar11 + dVar18 * dVar13;
    dVar17 = ABS(dVar19);
    if (ABS(dVar19) <= ABS(dVar23)) {
      dVar17 = ABS(dVar23);
    }
    if (dVar17 <= ABS(dVar20)) {
      dVar17 = ABS(dVar20);
    }
    dVar24 = 1.0 / dVar17;
    if (1e-10 < dVar17) {
      dVar20 = dVar20 * dVar24;
    }
    uVar4 = (uint)(1e-10 < dVar17);
    auVar22._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
    auVar22._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar22._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    dVar17 = (double)(~auVar22._0_8_ & (ulong)dVar19 | (ulong)(dVar24 * dVar19) & auVar22._0_8_);
    dVar19 = (double)(~auVar22._8_8_ & (ulong)dVar23 | (ulong)(dVar24 * dVar23) & auVar22._8_8_);
  } while ((uVar2 < 3 ||
            1e-08 <= (dVar15 - dVar20) * (dVar15 - dVar20) +
                     (dVar18 - dVar19) * (dVar18 - dVar19) + (dVar21 - dVar17) * (dVar21 - dVar17))
          && (bVar7 = uVar2 != 7, dVar15 = dVar20, dVar21 = dVar17, dVar18 = dVar19,
             uVar2 = uVar2 + 1, bVar7));
  dVar8 = dVar20 * dVar20 + dVar17 * dVar17 + dVar19 * dVar19;
  if (1e-10 <= dVar8) {
    dVar8 = 1.0 / SQRT(dVar8);
    *(ulong *)axis->m_s = CONCAT44((float)(dVar19 * dVar8),(float)(dVar17 * dVar8));
    axis->m_s[2] = (float)(dVar20 * dVar8);
    return;
  }
  if (axis != def) {
    lVar3 = 0;
    do {
      axis->m_s[lVar3] = def->m_s[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def)
    {
        double cov[6] = { 0, 0, 0, 0, 0, 0 };
        for (uint i = 0; i < norm_colors.size(); i++)
        {
            const vec3F& v = norm_colors[i];
            float r = v[0];
            float g = v[1];
            float b = v[2];
            if (m_unique_colors[i].m_weight > 1)
            {
                const double weight = m_unique_colors[i].m_weight;
                cov[0] += r * r * weight;
                cov[1] += r * g * weight;
                cov[2] += r * b * weight;
                cov[3] += g * g * weight;
                cov[4] += g * b * weight;
                cov[5] += b * b * weight;
            }
            else
            {
                cov[0] += r * r;
                cov[1] += r * g;
                cov[2] += r * b;
                cov[3] += g * g;
                cov[4] += g * b;
                cov[5] += b * b;
            }
        }
        double vfr = .9f;
        double vfg = 1.0f;
        double vfb = .7f;
        for (uint iter = 0; iter < 8; iter++)
        {
            double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
            double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
            double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
            double m = math::maximum(fabs(r), fabs(g), fabs(b));
            if (m > 1e-10)
            {
                m = 1.0f / m;
                r *= m;
                g *= m;
                b *= m;
            }
            double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
            vfr = r;
            vfg = g;
            vfb = b;
            if ((iter > 2) && (delta < 1e-8))
            {
                break;
            }
        }
        double len = vfr * vfr + vfg * vfg + vfb * vfb;
        if (len < 1e-10)
        {
            axis = def;
        }
        else
        {
            len = 1.0f / sqrt(len);
            axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
        }
    }